

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

DOMElement * __thiscall
xercesc_4_0::TraverseSchema::checkIdentityConstraintContent
          (TraverseSchema *this,DOMElement *content)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMNode *local_20;
  DOMElement *child;
  DOMElement *content_local;
  TraverseSchema *this_local;
  
  local_20 = &content->super_DOMNode;
  if (content != (DOMElement *)0x0) {
    do {
      iVar2 = (*local_20->_vptr_DOMNode[0x18])();
      bVar1 = isIdentityConstraintName(this,(XMLCh *)CONCAT44(extraout_var,iVar2));
      if (!bVar1) {
        return (DOMElement *)local_20;
      }
      local_20 = &XUtil::getNextSiblingElement(local_20)->super_DOMNode;
    } while (local_20 != (DOMNode *)0x0);
  }
  return (DOMElement *)local_20;
}

Assistant:

const DOMElement*
TraverseSchema::checkIdentityConstraintContent(const DOMElement* const content) {

    const DOMElement* child = content;

    if (child != 0) {

        do {

            if (!isIdentityConstraintName(child->getLocalName())) {
                break;
            }

            child = XUtil::getNextSiblingElement(child);

        } while (child != 0);
    }

    return child;
}